

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O3

OutputFile * __thiscall re2c::OutputFile::wrange(OutputFile *this,uint32_t l,uint32_t u)

{
  printSpan((ostream *)
            &((this->blocks).
              super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]->fragments).
             super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1]->stream,l,u);
  return this;
}

Assistant:

OutputFile & OutputFile::wrange (uint32_t l, uint32_t u)
{
	printSpan (stream (), l, u);
	return *this;
}